

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

void setTimeZoneFilesDir(char *path,UErrorCode *status)

{
  CharString *this;
  StringPiece local_28;
  
  this = gTimeZoneFilesDirectory;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    gTimeZoneFilesDirectory->len = 0;
    *(this->buffer).ptr = '\0';
    icu_63::StringPiece::StringPiece(&local_28,path);
    icu_63::CharString::append(this,local_28.ptr_,local_28.length_,status);
  }
  return;
}

Assistant:

static void setTimeZoneFilesDir(const char *path, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    gTimeZoneFilesDirectory->clear();
    gTimeZoneFilesDirectory->append(path, status);
#if (U_FILE_SEP_CHAR != U_FILE_ALT_SEP_CHAR)
    char *p = gTimeZoneFilesDirectory->data();
    while ((p = uprv_strchr(p, U_FILE_ALT_SEP_CHAR)) != NULL) {
        *p = U_FILE_SEP_CHAR;
    }
#endif
}